

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<unsigned_long> *value)

{
  bool bVar1;
  uint64_t v;
  storage_t<unsigned_long> local_30;
  optional<unsigned_long> local_28;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,(uint64_t *)&local_30);
    if (bVar1) {
      local_28.has_value_ = true;
      local_28.contained = local_30;
      nonstd::optional_lite::optional<unsigned_long>::operator=(value,&local_28);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<uint64_t> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  uint64_t v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}